

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 floatx80_sub_ppc64(floatx80 a,floatx80 b,float_status *status)

{
  unkuint10 Var1;
  unkuint10 Var2;
  _Bool _Var3;
  flag zSign;
  flag fVar4;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 b_00;
  floatx80 b_01;
  floatx80 fVar5;
  floatx80 fVar6;
  flag bSign;
  flag aSign;
  float_status *status_local;
  floatx80 b_local;
  floatx80 a_local;
  undefined2 local_10;
  
  Var2 = a._0_10_;
  fVar5._10_6_ = 0;
  fVar5.low = (long)Var2;
  fVar5.high = (short)(Var2 >> 0x40);
  _Var3 = floatx80_invalid_encoding(fVar5);
  if (!_Var3) {
    Var1 = b._0_10_;
    a_00._10_6_ = 0;
    a_00.low = (long)Var1;
    a_00.high = (short)(Var1 >> 0x40);
    _Var3 = floatx80_invalid_encoding(a_00);
    if (!_Var3) {
      a_01._10_6_ = 0;
      a_01.low = (long)Var2;
      a_01.high = (short)(Var2 >> 0x40);
      zSign = extractFloatx80Sign(a_01);
      a_02._10_6_ = 0;
      a_02.low = (long)Var1;
      a_02.high = (short)(Var1 >> 0x40);
      fVar4 = extractFloatx80Sign(a_02);
      if (zSign == fVar4) {
        a_03._10_6_ = 0;
        a_03.low = (long)Var2;
        a_03.high = (short)(Var2 >> 0x40);
        b_00._10_6_ = 0;
        b_00.low = (long)Var1;
        b_00.high = (short)(Var1 >> 0x40);
        fVar5 = subFloatx80Sigs(a_03,b_00,zSign,status);
        local_10 = fVar5.high;
      }
      else {
        a_04._10_6_ = 0;
        a_04.low = (long)Var2;
        a_04.high = (short)(Var2 >> 0x40);
        b_01._10_6_ = 0;
        b_01.low = (long)Var1;
        b_01.high = (short)(Var1 >> 0x40);
        fVar5 = addFloatx80Sigs(a_04,b_01,zSign,status);
        local_10 = fVar5.high;
      }
      goto LAB_00fd8bee;
    }
  }
  float_raise_ppc64('\x01',status);
  fVar5 = floatx80_default_nan_ppc64(status);
  local_10 = fVar5.high;
LAB_00fd8bee:
  a_local._8_8_ = fVar5.low;
  fVar6._10_6_ = fVar5._10_6_;
  fVar6.high = local_10;
  fVar6.low = a_local._8_8_;
  return fVar6;
}

Assistant:

floatx80 floatx80_sub(floatx80 a, floatx80 b, float_status *status)
{
    flag aSign, bSign;

    if (floatx80_invalid_encoding(a) || floatx80_invalid_encoding(b)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aSign = extractFloatx80Sign( a );
    bSign = extractFloatx80Sign( b );
    if ( aSign == bSign ) {
        return subFloatx80Sigs(a, b, aSign, status);
    }
    else {
        return addFloatx80Sigs(a, b, aSign, status);
    }

}